

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void end_scope(ch_compilation *comp,uint8_t last_scope_size)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  undefined4 *data_start;
  ch_emit_scope *blob;
  ch_op op_1;
  ch_op op;
  undefined4 local_38;
  undefined4 local_34;
  
  bVar1 = comp->scope->locals_size - last_scope_size;
  if (bVar1 != 0) {
    lVar3 = -1;
    uVar2 = 0;
    do {
      if (comp->scope->locals[(ulong)comp->scope->locals_size + lVar3].is_captured == true) {
        local_34 = 0x15;
        blob = (comp->emit).emit_scope;
        data_start = &local_34;
      }
      else {
        local_38 = 1;
        blob = (comp->emit).emit_scope;
        data_start = &local_38;
      }
      ch_emit_write(&blob->bytecode,data_start,1);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (uVar2 < bVar1);
    comp->scope->locals_size = last_scope_size;
  }
  return;
}

Assistant:

void end_scope(ch_compilation *comp, uint8_t last_scope_size) {
  if (last_scope_size != comp->scope->locals_size) {
    uint8_t num_values_popped = comp->scope->locals_size - last_scope_size;

    for(uint8_t i = 0; i < num_values_popped; i++) {
      if (comp->scope->locals[comp->scope->locals_size - i - 1].is_captured) {
        EMIT_OP(GET_EMIT(comp), OP_CLOSE_UPVALUE);
      } else {
        EMIT_OP(GET_EMIT(comp), OP_POP);
      }
    }

    comp->scope->locals_size = last_scope_size;
  }
}